

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void multi_deltimeout(Curl_easy *data,expire_id eid)

{
  void *pvVar1;
  time_node *n;
  Curl_llist *timeoutlist;
  Curl_llist_node *e;
  expire_id eid_local;
  Curl_easy *data_local;
  
  timeoutlist = (Curl_llist *)Curl_llist_head(&(data->state).timeoutlist);
  while( true ) {
    if (timeoutlist == (Curl_llist *)0x0) {
      return;
    }
    pvVar1 = Curl_node_elem((Curl_llist_node *)timeoutlist);
    if (*(expire_id *)((long)pvVar1 + 0x30) == eid) break;
    timeoutlist = (Curl_llist *)Curl_node_next((Curl_llist_node *)timeoutlist);
  }
  Curl_node_remove((Curl_llist_node *)timeoutlist);
  return;
}

Assistant:

static void
multi_deltimeout(struct Curl_easy *data, expire_id eid)
{
  struct Curl_llist_node *e;
  struct Curl_llist *timeoutlist = &data->state.timeoutlist;
  /* find and remove the specific node from the list */
  for(e = Curl_llist_head(timeoutlist); e; e = Curl_node_next(e)) {
    struct time_node *n = Curl_node_elem(e);
    if(n->eid == eid) {
      Curl_node_remove(e);
      return;
    }
  }
}